

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.h
# Opt level: O2

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::EnumDescriptor>
                   (string *__return_storage_ptr__,EnumDescriptor *descriptor,FileDescriptor *file,
                   bool preSpace,bool postNewline)

{
  char cVar1;
  char cVar2;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar1 = *(char *)(*(long *)(descriptor + 0x20) + 0x49);
  cVar2 = cVar1;
  if (file != (FileDescriptor *)0x0 && cVar1 == '\0') {
    cVar2 = *(char *)(*(long *)(file + 0x78) + 0x9f);
  }
  if (cVar2 == '\0') {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_60);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    puVar3 = *(undefined8 **)(descriptor + 0x10);
    if (file != (FileDescriptor *)0x0 && cVar1 == '\0') {
      std::operator+(&local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar3,
                     " is deprecated.");
      this = &local_80;
      std::__cxx11::string::operator=((string *)&local_60,(string *)this);
    }
    else {
      std::operator+(&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)(descriptor + 8) + 0x20)," is deprecated (see ");
      std::operator+(&local_a0,&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar3);
      std::operator+(&local_80,&local_a0,").");
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      this = &local_40;
    }
    std::__cxx11::string::~string((string *)this);
    std::__cxx11::string::string((string *)&local_a0,"GPB_DEPRECATED_MSG(\"",(allocator *)&local_40)
    ;
    std::operator+(&local_80,&local_a0,&local_60);
    std::operator+(__return_storage_ptr__,&local_80,"\")");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    if (preSpace) {
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,(char *)0x0);
    }
    if (postNewline) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetOptionalDeprecatedAttribute(const TDescriptor* descriptor,
                                           const FileDescriptor* file = NULL,
                                           bool preSpace = true,
                                           bool postNewline = false) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  bool isFileLevelDeprecation = false;
  if (!isDeprecated && file) {
    isFileLevelDeprecation = file->options().deprecated();
    isDeprecated = isFileLevelDeprecation;
  }
  if (isDeprecated) {
    std::string message;
    const FileDescriptor* sourceFile = descriptor->file();
    if (isFileLevelDeprecation) {
      message = sourceFile->name() + " is deprecated.";
    } else {
      message = descriptor->full_name() + " is deprecated (see " +
                sourceFile->name() + ").";
    }

    std::string result = std::string("GPB_DEPRECATED_MSG(\"") + message + "\")";
    if (preSpace) {
      result.insert(0, " ");
    }
    if (postNewline) {
      result.append("\n");
    }
    return result;
  } else {
    return "";
  }
}